

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  _Setw _Var2;
  ostream *poVar3;
  long lVar4;
  undefined1 local_360 [8];
  PmxModel x;
  istream is;
  streambuf local_108 [8];
  filebuf fb;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    std::filebuf::filebuf(local_108);
    pcVar1 = argv[1];
    std::operator|(_S_in,_S_bin);
    lVar4 = std::filebuf::open((char *)local_108,(_Ios_Openmode)pcVar1);
    if (lVar4 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Can\'t open the ");
      poVar3 = std::operator<<(poVar3,argv[1]);
      poVar3 = std::operator<<(poVar3,", please check");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    std::istream::istream(&x.soft_bodies,local_108);
    pmx::PmxModel::PmxModel((PmxModel *)local_360);
    pmx::PmxModel::Read((PmxModel *)local_360,(istream *)&x.soft_bodies);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"PMX version");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_360._0_4_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"Model Name");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = std::operator<<(poVar3,(string *)&x.setting.material_index_size);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"Model English Name");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = std::operator<<(poVar3,(string *)&x.field_0x28);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"Comment");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = std::operator<<(poVar3,(string *)&x.field_0x48);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"English Comment");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = std::operator<<(poVar3,(string *)&x.field_0x68);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#vertex");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x._136_4_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#index");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.vertices._M_t.
                                    super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>
                                    .super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#texture");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.indices._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#material");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.textures._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#bone");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.materials._M_t.
                                    super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                    .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#morph");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.bones._M_t.
                                    super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>
                                    .super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#frame");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.morphs._M_t.
                                    super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>
                                    .super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#rigid body");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.frames._M_t.
                                    super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>
                                    .super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#joint");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.rigid_bodies._M_t.
                                    super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>
                                    .super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl)
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,"#soft body");
    poVar3 = std::operator<<(poVar3,":");
    _Var2 = std::setw(0x18);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::right);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(int)x.joints._M_t.
                                    super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>
                                    .super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pmx::PmxModel::~PmxModel((PmxModel *)local_360);
    std::istream::~istream(&x.soft_bodies);
    std::filebuf::~filebuf(local_108);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ./demo [PMX file path]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc != 2) {
        std::cout << "Usage: ./demo [PMX file path]" << std::endl;
        return 0;
    }
    std::filebuf fb;
    if(!fb.open(argv[1], std::ios::in | std::ios::binary)) {
        std::cout << "Can't open the " << argv[1] << ", please check" << std::endl;
        exit(-1);
    }

    std::istream is(&fb);
    pmx::PmxModel x;
    x.Read(&is);
    
    PRINT("PMX version", x.version)
    PRINT("Model Name", x.model_name)
    PRINT("Model English Name", x.model_english_name)
    PRINT("Comment", x.model_comment)
    PRINT("English Comment", x.model_english_comment)
    PRINT("#vertex", x.vertex_count)
    PRINT("#index", x.index_count)
    PRINT("#texture", x.texture_count)
    PRINT("#material", x.material_count)
    PRINT("#bone", x.bone_count)
    PRINT("#morph", x.morph_count)
    PRINT("#frame", x.frame_count)
    PRINT("#rigid body", x.rigid_body_count)
    PRINT("#joint", x.joint_count)
    PRINT("#soft body", x.soft_body_count)
}